

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9RegisterIORoutine(jx9_vm *pVm)

{
  uint local_1c;
  sxu32 n;
  jx9_io_stream *pFileStream;
  jx9_vm *pVm_local;
  
  for (local_1c = 0; local_1c < 0x3b; local_1c = local_1c + 1) {
    jx9_create_function(pVm,jx9RegisterIORoutine::aVfsFunc[local_1c].zName,
                        jx9RegisterIORoutine::aVfsFunc[local_1c].xFunc,pVm->pEngine->pVfs);
  }
  for (local_1c = 0; local_1c < 0x1f; local_1c = local_1c + 1) {
    jx9_create_function(pVm,jx9RegisterIORoutine::aIOFunc[local_1c].zName,
                        jx9RegisterIORoutine::aIOFunc[local_1c].xFunc,pVm);
  }
  jx9_vm_config(pVm,0xb,&sjx9Stream);
  jx9_vm_config(pVm,0xb,&sUnixFileStream);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9RegisterIORoutine(jx9_vm *pVm)
{
#ifndef JX9_DISABLE_BUILTIN_FUNC
	      /* VFS functions */
	static const jx9_builtin_func aVfsFunc[] = {
		{"chdir",   jx9Vfs_chdir   }, 
		{"chroot",  jx9Vfs_chroot  }, 
		{"getcwd",  jx9Vfs_getcwd  }, 
		{"rmdir",   jx9Vfs_rmdir   }, 
		{"is_dir",  jx9Vfs_is_dir  }, 
		{"mkdir",   jx9Vfs_mkdir   }, 
		{"rename",  jx9Vfs_rename  }, 
		{"realpath", jx9Vfs_realpath}, 
		{"sleep",   jx9Vfs_sleep   }, 
		{"usleep",  jx9Vfs_usleep  }, 
		{"unlink",  jx9Vfs_unlink  }, 
		{"delete",  jx9Vfs_unlink  }, 
		{"chmod",   jx9Vfs_chmod   }, 
		{"chown",   jx9Vfs_chown   }, 
		{"chgrp",   jx9Vfs_chgrp   }, 
		{"disk_free_space", jx9Vfs_disk_free_space  }, 
		{"disk_total_space", jx9Vfs_disk_total_space}, 
		{"file_exists", jx9Vfs_file_exists }, 
		{"filesize",    jx9Vfs_file_size   }, 
		{"fileatime",   jx9Vfs_file_atime  }, 
		{"filemtime",   jx9Vfs_file_mtime  }, 
		{"filectime",   jx9Vfs_file_ctime  }, 
		{"is_file",     jx9Vfs_is_file  }, 
		{"is_link",     jx9Vfs_is_link  }, 
		{"is_readable", jx9Vfs_is_readable   }, 
		{"is_writable", jx9Vfs_is_writable   }, 
		{"is_executable", jx9Vfs_is_executable}, 
		{"filetype",    jx9Vfs_filetype }, 
		{"stat",        jx9Vfs_stat     }, 
		{"lstat",       jx9Vfs_lstat    }, 
		{"getenv",      jx9Vfs_getenv   }, 
		{"setenv",      jx9Vfs_putenv   }, 
		{"putenv",      jx9Vfs_putenv   }, 
		{"touch",       jx9Vfs_touch    }, 
		{"link",        jx9Vfs_link     }, 
		{"symlink",     jx9Vfs_symlink  }, 
		{"umask",       jx9Vfs_umask    }, 
		{"sys_get_temp_dir", jx9Vfs_sys_get_temp_dir }, 
		{"get_current_user", jx9Vfs_get_current_user }, 
		{"getpid",      jx9Vfs_getmypid }, 
		{"getuid",      jx9Vfs_getmyuid }, 
		{"getgid",      jx9Vfs_getmygid }, 
		{"uname",       jx9Vfs_uname}, 
		     /* Path processing */ 
		{"dirname",     jx9Builtin_dirname  }, 
		{"basename",    jx9Builtin_basename }, 
		{"pathinfo",    jx9Builtin_pathinfo }, 
		{"strglob",     jx9Builtin_strglob  }, 
		{"fnmatch",     jx9Builtin_fnmatch  }, 
		     /* ZIP processing */
		{"zip_open",    jx9Builtin_zip_open }, 
		{"zip_close",   jx9Builtin_zip_close}, 
		{"zip_read",    jx9Builtin_zip_read }, 
		{"zip_entry_open", jx9Builtin_zip_entry_open }, 
		{"zip_entry_close", jx9Builtin_zip_entry_close}, 
		{"zip_entry_name", jx9Builtin_zip_entry_name }, 
		{"zip_entry_filesize",      jx9Builtin_zip_entry_filesize       }, 
		{"zip_entry_compressedsize", jx9Builtin_zip_entry_compressedsize }, 
		{"zip_entry_read", jx9Builtin_zip_entry_read }, 
		{"zip_entry_reset_cursor", jx9Builtin_zip_entry_reset_cursor}, 
		{"zip_entry_compressionmethod", jx9Builtin_zip_entry_compressionmethod}
	};
	    /* IO stream functions */
	static const jx9_builtin_func aIOFunc[] = {
		{"ftruncate", jx9Builtin_ftruncate }, 
		{"fseek",     jx9Builtin_fseek  }, 
		{"ftell",     jx9Builtin_ftell  }, 
		{"rewind",    jx9Builtin_rewind }, 
		{"fflush",    jx9Builtin_fflush }, 
		{"feof",      jx9Builtin_feof   }, 
		{"fgetc",     jx9Builtin_fgetc  }, 
		{"fgets",     jx9Builtin_fgets  }, 
		{"fread",     jx9Builtin_fread  }, 
		{"fgetcsv",   jx9Builtin_fgetcsv}, 
		{"fgetss",    jx9Builtin_fgetss }, 
		{"readdir",   jx9Builtin_readdir}, 
		{"rewinddir", jx9Builtin_rewinddir }, 
		{"closedir",  jx9Builtin_closedir}, 
		{"opendir",   jx9Builtin_opendir }, 
		{"readfile",  jx9Builtin_readfile}, 
		{"file_get_contents", jx9Builtin_file_get_contents}, 
		{"file_put_contents", jx9Builtin_file_put_contents}, 
		{"file",      jx9Builtin_file   }, 
		{"copy",      jx9Builtin_copy   }, 
		{"fstat",     jx9Builtin_fstat  }, 
		{"fwrite",    jx9Builtin_fwrite }, 
		{"fputs",     jx9Builtin_fwrite }, 
		{"flock",     jx9Builtin_flock  }, 
		{"fclose",    jx9Builtin_fclose }, 
		{"fopen",     jx9Builtin_fopen  }, 
		{"fpassthru", jx9Builtin_fpassthru }, 
		{"fputcsv",   jx9Builtin_fputcsv }, 
		{"fprintf",   jx9Builtin_fprintf }, 
#if !defined(JX9_DISABLE_HASH_FUNC)
		{"md5_file",  jx9Builtin_md5_file}, 
		{"sha1_file", jx9Builtin_sha1_file}, 
#endif /* JX9_DISABLE_HASH_FUNC */
		{"parse_ini_file", jx9Builtin_parse_ini_file}, 
		{"vfprintf",  jx9Builtin_vfprintf}
	};
	const jx9_io_stream *pFileStream = 0;
	sxu32 n = 0;
	/* Register the functions defined above */
	for( n = 0 ; n < SX_ARRAYSIZE(aVfsFunc) ; ++n ){
		jx9_create_function(&(*pVm), aVfsFunc[n].zName, aVfsFunc[n].xFunc, (void *)pVm->pEngine->pVfs);
	}
	for( n = 0 ; n < SX_ARRAYSIZE(aIOFunc) ; ++n ){
		jx9_create_function(&(*pVm), aIOFunc[n].zName, aIOFunc[n].xFunc, pVm);
	}
#ifndef JX9_DISABLE_DISK_IO
	/* Register the file stream if available */
#ifdef __WINNT__
	pFileStream = &sWinFileStream;
#elif defined(__UNIXES__)
	pFileStream = &sUnixFileStream;
#endif
	/* Install the jx9:// stream */
	jx9_vm_config(pVm, JX9_VM_CONFIG_IO_STREAM, &sjx9Stream);
#endif /* JX9_DISABLE_DISK_IO */
	if( pFileStream ){
		/* Install the file:// stream */
		jx9_vm_config(pVm, JX9_VM_CONFIG_IO_STREAM, pFileStream);
	}
#else
   SXUNUSED(pVm); /* cc warning */
#endif /* JX9_DISABLE_BUILTIN_FUNC */
	return SXRET_OK;
}